

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

void __thiscall FlowGraph::UpdateRegionForBlock(FlowGraph *this,BasicBlock *block)

{
  IRKind IVar1;
  Type pSVar2;
  BasicBlock *pBVar3;
  code *pcVar4;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar5;
  bool bVar6;
  ExecutionMode EVar7;
  BOOL BVar8;
  undefined4 *puVar9;
  Type *ppFVar10;
  BasicBlock *pBVar11;
  BasicBlock *blNext;
  Func **ppFVar12;
  long lVar13;
  Type pSVar14;
  long lVar15;
  Instr *pIVar16;
  BasicBlock *pBVar17;
  Instr *local_60;
  Instr *tryInstr;
  undefined1 local_50 [8];
  Iterator __iter;
  BasicBlock *block_local;
  Region *region;
  
  local_60 = (Instr *)0x0;
  pIVar16 = block->firstInstr;
  __iter.current = (NodeBase *)block;
  if (((pIVar16->m_kind == InstrKindProfiledLabel) || (pIVar16->m_kind == InstrKindLabel)) &&
     (pIVar16[1].m_src2 != (Opnd *)0x0)) {
    BVar8 = Func::HasTry(this->func);
    if (BVar8 != 0) {
      bVar6 = Func::DoOptimizeTry(this->func);
      if (bVar6) {
        return;
      }
      EVar7 = JITTimeWorkItem::GetJitMode(this->func->m_workItem);
      if ((EVar7 == SimpleJit) && ((this->func->field_0x240 & 0x10) != 0)) {
        return;
      }
      bVar6 = Func::IsLoopBodyInTryFinally(this->func);
      if (bVar6) {
        return;
      }
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x77c,"(assignRegionsBeforeGlobopt)","assignRegionsBeforeGlobopt");
    if (bVar6) {
      *puVar9 = 0;
      return;
    }
    goto LAB_004175b8;
  }
  tryInstr = pIVar16;
  if (block == this->blockList) {
    pBVar17 = (BasicBlock *)0x0;
    block_local = (BasicBlock *)Region::New(RegionTypeRoot,(Region *)0x0,this->func);
  }
  else {
    block_local = (BasicBlock *)0x0;
    local_50 = (undefined1  [8])&block->predList;
    __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_50;
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    pBVar17 = (BasicBlock *)0x0;
    do {
      if (__iter.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar6) goto LAB_004175b8;
        *puVar9 = 0;
      }
      __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                    ((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
      pSVar5 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
      if ((undefined1  [8])__iter.list == local_50) goto LAB_004171d7;
      ppFVar10 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                           ((Iterator *)local_50);
      pBVar11 = (*ppFVar10)->predBlock;
      if (pBVar11 == (BasicBlock *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0x78a,"(predBlock)","predBlock");
        if (!bVar6) goto LAB_004175b8;
        *puVar9 = 0;
      }
      if (this->blockCount <= pBVar11->number) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0x78c,"(predBlock->GetBlockNum() < this->blockCount)",
                           "Misnumbered block at teardown time?");
        if (!bVar6) goto LAB_004175b8;
        *puVar9 = 0;
      }
      pIVar16 = pBVar11->firstInstr;
      IVar1 = pIVar16->m_kind;
      if ((IVar1 != InstrKindLabel) && (IVar1 != InstrKindProfiledLabel)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
        if (!bVar6) goto LAB_004175b8;
        *puVar9 = 0;
      }
      pBVar17 = (BasicBlock *)pIVar16[1].m_src2;
    } while (pBVar17 == (BasicBlock *)0x0);
    block_local = (BasicBlock *)
                  PropagateRegionFromPred
                            (this,(BasicBlock *)__iter.current,pBVar11,(Region *)pBVar17,&local_60);
    pSVar5 = __iter.list;
LAB_004171d7:
    __iter.list = pSVar5;
    pIVar16 = tryInstr;
    pSVar2 = (__iter.current)->next;
    pSVar14 = pSVar2 + 0x38;
    if (pSVar2 == (Type)0x0) {
      pSVar14 = __iter.current + 0x41;
    }
    lVar13 = 0x18;
    lVar15 = 0x18;
    if (pSVar2 == (Type)0x0) {
      lVar15 = 0xd0;
    }
    if (*(short *)(*(long *)((long)&pSVar14->next->next + lVar15) + 0x30) != 0xea) {
      pSVar14 = pSVar2 + 0x38;
      if (pSVar2 == (Type)0x0) {
        lVar13 = 0xd0;
        pSVar14 = __iter.current + 0x41;
      }
      if (*(short *)(*(long *)((long)&pSVar14->next->next + lVar13) + 0x30) != 0xeb)
      goto LAB_00417294;
    }
    if (((this->regToFinallyEndMap !=
          (BaseDictionary<Region_*,_BasicBlock_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *)0x0) && (*(char *)&block_local->next == '\x04')) &&
       (*(BasicBlock **)
         &(block_local->loop->blockList).
          super_SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>.super_RealCount ==
        block_local)) {
      bVar6 = JsUtil::
              BaseDictionary<Region_*,_BasicBlock_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::ContainsKey(this->regToFinallyEndMap,(Region **)&block_local);
      if (bVar6) {
        pBVar11 = JsUtil::
                  BaseDictionary<Region_*,_BasicBlock_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  ::Item(this->regToFinallyEndMap,(Region **)&block_local);
      }
      else {
        pBVar11 = (BasicBlock *)0x0;
      }
      if (pBVar11 == (BasicBlock *)0x0) {
        JsUtil::
        BaseDictionary<Region*,BasicBlock*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
        ::
        Insert<(JsUtil::BaseDictionary<Region*,BasicBlock*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                  ((BaseDictionary<Region*,BasicBlock*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                    *)this->regToFinallyEndMap,(Region **)&block_local,
                   (BasicBlock **)&__iter.current);
      }
      else {
        pBVar3 = pBVar11->next;
        ppFVar12 = (Func **)&pBVar3->firstInstr;
        if (pBVar3 == (BasicBlock *)0x0) {
          ppFVar12 = &pBVar11->func;
        }
        lVar13 = 0x18;
        if (pBVar3 == (BasicBlock *)0x0) {
          lVar13 = 0xd0;
        }
        if ((*(short *)(*(long *)((long)&(*ppFVar12)->m_alloc + lVar13) + 0x30) == 0xea) &&
           ((BasicBlock *)__iter.current != pBVar11)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar9 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                             ,0x7a1,
                             "(endOfFinally->GetLastInstr()->m_opcode != Js::OpCode::LeaveNull || block == endOfFinally)"
                             ,
                             "endOfFinally->GetLastInstr()->m_opcode != Js::OpCode::LeaveNull || block == endOfFinally"
                            );
          if (!bVar6) goto LAB_004175b8;
          *puVar9 = 0;
        }
        JsUtil::
        BaseDictionary<Region*,BasicBlock*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
        ::
        Insert<(JsUtil::BaseDictionary<Region*,BasicBlock*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
                  ((BaseDictionary<Region*,BasicBlock*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                    *)this->regToFinallyEndMap,(Region **)&block_local,
                   (BasicBlock **)&__iter.current);
      }
    }
  }
LAB_00417294:
  if ((block_local != (BasicBlock *)0x0) &&
     (block_local->excludeByteCodeUpwardExposedTracking ==
      (BVSparse<Memory::JitArenaAllocator> *)0x0)) {
    Region::AllocateEHBailoutData((Region *)block_local,this->func,local_60);
  }
  if ((pIVar16->m_kind != InstrKindLabel) && (pIVar16->m_kind != InstrKindProfiledLabel)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x7ad,"(firstInstr->IsLabelInstr())","firstInstr->IsLabelInstr()");
    if (!bVar6) {
LAB_004175b8:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar9 = 0;
  }
  if ((pIVar16->m_kind == InstrKindProfiledLabel) || (pIVar16->m_kind == InstrKindLabel)) {
    pIVar16[1].m_src2 = (Opnd *)block_local;
    if (block_local != pBVar17) {
      *(byte *)&pIVar16[1].m_func = *(byte *)&pIVar16[1].m_func | 4;
    }
    if (((ulong)pIVar16[1].m_func & 4) == 0) {
      local_50 = (undefined1  [8])(__iter.current + 0x39);
      __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_50;
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      do {
        if (__iter.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar9 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar6) goto LAB_004175b8;
          *puVar9 = 0;
        }
        __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                      ((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
        if ((undefined1  [8])__iter.list == local_50) {
          return;
        }
        ppFVar10 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                             ((Iterator *)local_50);
        pBVar17 = (*ppFVar10)->predBlock;
        if (pBVar17 == (BasicBlock *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar9 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                             ,0x7bf,"(predBlock)","predBlock");
          if (!bVar6) goto LAB_004175b8;
          *puVar9 = 0;
        }
        if (this->blockCount <= pBVar17->number) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar9 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                             ,0x7c1,"(predBlock->GetBlockNum() < this->blockCount)",
                             "Misnumbered block at teardown time?");
          if (!bVar6) goto LAB_004175b8;
          *puVar9 = 0;
        }
        pIVar16 = pBVar17->firstInstr;
        IVar1 = pIVar16->m_kind;
        if ((IVar1 != InstrKindLabel) && (IVar1 != InstrKindProfiledLabel)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar9 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
          if (!bVar6) goto LAB_004175b8;
          *puVar9 = 0;
        }
      } while ((BasicBlock *)pIVar16[1].m_src2 == block_local);
      *(byte *)&tryInstr[1].m_func = *(byte *)&tryInstr[1].m_func | 4;
    }
  }
  return;
}

Assistant:

void
FlowGraph::UpdateRegionForBlock(BasicBlock * block)
{
    Region *region;
    Region * predRegion = nullptr;
    IR::Instr * tryInstr = nullptr;
    IR::Instr * firstInstr = block->GetFirstInstr();
    if (firstInstr->IsLabelInstr() && firstInstr->AsLabelInstr()->GetRegion())
    {
#if DBG
        bool assignRegionsBeforeGlobopt = this->func->HasTry() && (this->func->DoOptimizeTry() ||
        (this->func->IsSimpleJit() && this->func->hasBailout) ||
        this->func->IsLoopBodyInTryFinally());
        Assert(assignRegionsBeforeGlobopt);
#endif
        return;
    }

    if (block == this->blockList)
    {
        // Head of the graph: create the root region.
        region = Region::New(RegionTypeRoot, nullptr, this->func);
    }
    else
    {
        // Propagate the region forward by finding a predecessor we've already processed.
        region = nullptr;
        FOREACH_PREDECESSOR_BLOCK(predBlock, block)
        {
            AssertMsg(predBlock->GetBlockNum() < this->blockCount, "Misnumbered block at teardown time?");
            predRegion = predBlock->GetFirstInstr()->AsLabelInstr()->GetRegion();
            if (predRegion != nullptr)
            {
                region = this->PropagateRegionFromPred(block, predBlock, predRegion, tryInstr);
                break;
            }
        }
        NEXT_PREDECESSOR_BLOCK;

        if (block->GetLastInstr()->m_opcode == Js::OpCode::LeaveNull || block->GetLastInstr()->m_opcode == Js::OpCode::Leave)
        {
            if (this->regToFinallyEndMap && region->IsNonExceptingFinally())
            {
                BasicBlock *endOfFinally = regToFinallyEndMap->ContainsKey(region) ? regToFinallyEndMap->Item(region) : nullptr;
                if (!endOfFinally)
                {
                    regToFinallyEndMap->Add(region, block);
                }
                else
                {
                    Assert(endOfFinally->GetLastInstr()->m_opcode != Js::OpCode::LeaveNull || block == endOfFinally);
                    regToFinallyEndMap->Item(region, block);
                }
            }
        }
    }

    if (region && !region->ehBailoutData)
    {
        region->AllocateEHBailoutData(this->func, tryInstr);
    }

    Assert(firstInstr->IsLabelInstr());
    if (firstInstr->IsLabelInstr())
    {
        // Record the region on the label and make sure it stays around as a region
        // marker if we're entering a region at this point.
        IR::LabelInstr * labelInstr = firstInstr->AsLabelInstr();
        labelInstr->SetRegion(region);
        if (region != predRegion)
        {
            labelInstr->m_hasNonBranchRef = true;
        }

        // One of the pred blocks maybe an eh region, in that case it is important to mark this label's m_hasNonBranchRef
        // If not later in codegen, this label can get deleted. And during SccLiveness, region is propagated to newly created labels in lowerer from the previous label's region
        // We can end up assigning an eh region to a label in a non eh region. And if there is a bailout in such a region, bad things will happen in the interpreter :)
        // See test2()/test3() in tryfinallytests.js
        if (!labelInstr->m_hasNonBranchRef)
        {
            FOREACH_PREDECESSOR_BLOCK(predBlock, block)
            {
                AssertMsg(predBlock->GetBlockNum() < this->blockCount, "Misnumbered block at teardown time?");
                predRegion = predBlock->GetFirstInstr()->AsLabelInstr()->GetRegion();
                if (predRegion != region)
                {
                    labelInstr->m_hasNonBranchRef = true;
                    break;
                }
            }
            NEXT_PREDECESSOR_BLOCK;
        }
    }
}